

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int expand(archive_read *a,int64_t *end)

{
  long *plVar1;
  byte bVar2;
  void *pvVar3;
  undefined8 uVar4;
  bool bVar5;
  archive_read *a_00;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  uint uVar11;
  uint8_t *puVar12;
  undefined4 extraout_var;
  byte *buf;
  rar_program_code *prog;
  uLong uVar13;
  undefined8 *__ptr;
  uint uVar14;
  ulong uVar15;
  uint8_t uVar16;
  long *plVar17;
  uint uVar18;
  ulong uVar19;
  void *pvVar20;
  size_t __size;
  void *pvVar21;
  uint64_t uVar22;
  ulong uVar23;
  size_t sVar24;
  undefined1 uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  uint8_t flags;
  memory_bit_reader br;
  byte local_13a;
  byte local_139;
  archive_read *local_138;
  ulong local_130;
  memory_bit_reader local_128;
  rar_br *local_100;
  uint32_t local_f4;
  long *local_f0;
  memory_bit_reader local_e8;
  undefined8 local_b8;
  void *local_b0;
  uint8_t *local_a8;
  long local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  byte *local_60;
  huffman_code *local_58;
  void *local_50;
  huffman_code *local_48;
  huffman_code *local_40;
  huffman_code *local_38;
  
  pvVar3 = a->format->data;
  if (*(long *)((long)pvVar3 + 0x3a8) < *end) {
    *end = *(long *)((long)pvVar3 + 0x3a8);
  }
  lVar29 = *(long *)((long)pvVar3 + 0x360);
  if (lVar29 < *end) {
    if (*(char *)((long)pvVar3 + 0x3d2) == '\0') {
      local_100 = (rar_br *)((long)pvVar3 + 0x4f30);
      local_38 = (huffman_code *)((long)pvVar3 + 0x118);
      local_48 = (huffman_code *)((long)pvVar3 + 0x140);
      local_58 = (huffman_code *)((long)pvVar3 + 0x168);
      local_90 = (undefined8 *)((long)pvVar3 + 0x370);
      local_40 = (huffman_code *)((long)pvVar3 + 400);
      local_98 = (undefined8 *)((long)pvVar3 + 0x374);
      local_138 = a;
      local_f0 = end;
      do {
        a_00 = local_138;
        iVar7 = read_next_symbol(local_138,local_38);
        if (iVar7 < 0) {
          return -0x1e;
        }
        if (iVar7 < 0x100) {
          *(char *)(*(long *)((long)pvVar3 + 0x350) +
                   (long)(int)(*(uint *)((long)pvVar3 + 0x358) & *(uint *)((long)pvVar3 + 0x360))) =
               (char)iVar7;
          *(long *)((long)pvVar3 + 0x360) = *(long *)((long)pvVar3 + 0x360) + 1;
        }
        else if (iVar7 == 0x102) {
          uVar26 = *(uint *)((long)pvVar3 + 0x368);
          if (uVar26 != 0) {
            iVar27 = *(int *)((long)pvVar3 + 0x36c);
LAB_006354cb:
            *(int *)((long)pvVar3 + 0x36c) = iVar27;
            *(uint *)((long)pvVar3 + 0x368) = uVar26;
            if (0 < (int)uVar26) {
              uVar11 = *(uint *)((long)pvVar3 + 0x360) & *(uint *)((long)pvVar3 + 0x358);
              uVar28 = uVar11 - iVar27 & *(uint *)((long)pvVar3 + 0x358);
              uVar14 = uVar26;
              do {
                uVar30 = uVar28;
                if ((int)uVar28 < (int)uVar11) {
                  uVar30 = uVar11;
                }
                uVar30 = (*(int *)((long)pvVar3 + 0x358) - uVar30) + 1;
                if ((int)uVar14 < (int)uVar30) {
                  uVar30 = uVar14;
                }
                pvVar21 = (void *)((long)(int)uVar11 + *(long *)((long)pvVar3 + 0x350));
                pvVar20 = (void *)(*(long *)((long)pvVar3 + 0x350) + (long)(int)uVar28);
                if (((int)(uVar30 + uVar11) < (int)uVar28) || ((int)(uVar30 + uVar28) < (int)uVar11)
                   ) {
                  memcpy(pvVar21,pvVar20,(long)(int)uVar30);
                }
                else if (0 < (int)uVar30) {
                  uVar15 = 0;
                  do {
                    *(undefined1 *)((long)pvVar21 + uVar15) =
                         *(undefined1 *)((long)pvVar20 + uVar15);
                    uVar15 = uVar15 + 1;
                  } while (uVar30 != uVar15);
                }
                uVar11 = uVar30 + uVar11 & *(uint *)((long)pvVar3 + 0x358);
                uVar28 = uVar30 + uVar28 & *(uint *)((long)pvVar3 + 0x358);
                uVar18 = uVar14 - uVar30;
                bVar5 = (int)uVar30 <= (int)uVar14;
                uVar14 = uVar18;
              } while (uVar18 != 0 && bVar5);
            }
            *(long *)((long)pvVar3 + 0x360) = *(long *)((long)pvVar3 + 0x360) + (long)(int)uVar26;
            end = local_f0;
          }
        }
        else {
          if (iVar7 != 0x101) {
            if (iVar7 == 0x100) {
              if (((*(int *)((long)pvVar3 + 0x4f38) < 1) &&
                  (iVar7 = rar_br_fillup(local_138,local_100), iVar7 == 0)) &&
                 (*(int *)((long)pvVar3 + 0x4f38) < 1)) {
LAB_00635946:
                archive_set_error(&local_138->archive,0x54,"Truncated RAR file data");
                *(undefined1 *)((long)pvVar3 + 0xd0) = 0;
                return -0x1e;
              }
              iVar7 = *(int *)((long)pvVar3 + 0x4f38);
              uVar14 = iVar7 - 1;
              *(uint *)((long)pvVar3 + 0x4f38) = uVar14;
              if ((*(ulong *)((long)pvVar3 + 0x4f30) >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
                *(undefined1 *)((long)pvVar3 + 0xec) = 1;
                if (((1 < iVar7) || (iVar7 = rar_br_fillup(local_138,local_100), iVar7 != 0)) ||
                   (0 < *(int *)((long)pvVar3 + 0x4f38))) {
                  uVar14 = *(int *)((long)pvVar3 + 0x4f38) - 1;
                  *(bool *)((long)pvVar3 + 0x388) =
                       (*(ulong *)((long)pvVar3 + 0x4f30) >> ((ulong)uVar14 & 0x3f) & 1) != 0;
                  *(uint *)((long)pvVar3 + 0x4f38) = uVar14;
                  *local_f0 = *(long *)((long)pvVar3 + 0x360);
                  return 0;
                }
                goto LAB_00635946;
              }
              iVar7 = parse_codes(local_138);
              end = local_f0;
              if (iVar7 != 0) {
                return -0x1e;
              }
              goto LAB_00635581;
            }
            if (iVar7 < 0x107) {
              uVar15 = (ulong)(iVar7 - 0x103);
              iVar27 = *(int *)((long)pvVar3 + uVar15 * 4 + 0x370);
              uVar14 = read_next_symbol(a_00,local_40);
              if (0x1c < uVar14) goto LAB_0063590f;
              uVar26 = ""[uVar14] + 2;
              if (7 < uVar14) {
                bVar6 = ""[uVar14];
                uVar14 = (uint)bVar6;
                if (*(int *)((long)pvVar3 + 0x4f38) < (int)(uint)bVar6) {
                  local_130 = CONCAT44(local_130._4_4_,(uint)bVar6);
                  iVar8 = rar_br_fillup(local_138,local_100);
                  uVar14 = (uint)local_130;
                  if ((iVar8 == 0) && (*(int *)((long)pvVar3 + 0x4f38) < (int)(uint)local_130))
                  goto LAB_00635946;
                }
                iVar8 = *(int *)((long)pvVar3 + 0x4f38) - uVar14;
                uVar26 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar8 & 0x3f)) &
                         cache_masks[uVar14]) + uVar26;
                *(int *)((long)pvVar3 + 0x4f38) = iVar8;
              }
              if (0x103 < iVar7) {
                do {
                  *(undefined4 *)((long)pvVar3 + uVar15 * 4 + 0x370) =
                       *(undefined4 *)((long)pvVar3 + uVar15 * 4 + 0x36c);
                  bVar5 = 1 < (long)uVar15;
                  uVar15 = uVar15 - 1;
                } while (bVar5);
              }
            }
            else {
              if (iVar7 < 0x10f) {
                bVar6 = ""[iVar7 - 0x107U];
                bVar2 = "\x02\x02\x03\x04\x05\x06\x06\x06"[iVar7 - 0x107U];
                if (((*(int *)((long)pvVar3 + 0x4f38) < (int)(uint)bVar2) &&
                    (iVar7 = rar_br_fillup(local_138,local_100), iVar7 == 0)) &&
                   (*(int *)((long)pvVar3 + 0x4f38) < (int)(uint)bVar2)) goto LAB_00635946;
                uVar15 = *(ulong *)((long)pvVar3 + 0x4f30);
                iVar7 = *(int *)((long)pvVar3 + 0x4f38) - (uint)bVar2;
                *(int *)((long)pvVar3 + 0x4f38) = iVar7;
                uVar4 = *local_90;
                *(undefined4 *)(local_98 + 1) = *(undefined4 *)(local_90 + 1);
                *local_98 = uVar4;
                iVar27 = ((uint)(uVar15 >> ((byte)iVar7 & 0x3f)) & cache_masks[bVar2]) + bVar6 + 1;
                *(int *)((long)pvVar3 + 0x370) = iVar27;
                uVar26 = 2;
                goto LAB_006354cb;
              }
              if (299 < iVar7) {
LAB_0063590f:
                archive_set_error(&local_138->archive,0x54,"Bad RAR file data");
                return -0x1e;
              }
              uVar14 = iVar7 - 0x10f;
              iVar7 = ""[uVar14] + 3;
              if (7 < uVar14) {
                bVar6 = ""[uVar14];
                if (((*(int *)((long)pvVar3 + 0x4f38) < (int)(uint)bVar6) &&
                    (iVar27 = rar_br_fillup(local_138,local_100), iVar27 == 0)) &&
                   (*(int *)((long)pvVar3 + 0x4f38) < (int)(uint)bVar6)) goto LAB_00635946;
                iVar27 = *(int *)((long)pvVar3 + 0x4f38) - (uint)bVar6;
                iVar7 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar27 & 0x3f)) &
                        cache_masks[bVar6]) + iVar7;
                *(int *)((long)pvVar3 + 0x4f38) = iVar27;
              }
              uVar14 = read_next_symbol(local_138,local_48);
              if (0x3c < uVar14) goto LAB_0063590f;
              uVar15 = (ulong)uVar14;
              iVar27 = expand::offsetbases[uVar15] + 1;
              if (3 < uVar14) {
                bVar6 = ""[uVar15];
                if ((int)uVar14 < 10) {
                  if (((*(int *)((long)pvVar3 + 0x4f38) < (int)(uint)bVar6) &&
                      (iVar8 = rar_br_fillup(local_138,local_100), iVar8 == 0)) &&
                     (*(int *)((long)pvVar3 + 0x4f38) < (int)(uint)bVar6)) goto LAB_00635946;
                  iVar8 = *(int *)((long)pvVar3 + 0x4f38) - (uint)bVar6;
                  iVar27 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar8 & 0x3f)) &
                           cache_masks[bVar6]) + iVar27;
                  *(int *)((long)pvVar3 + 0x4f38) = iVar8;
                }
                else {
                  if (uVar15 - 0xc < 0x30) {
                    iVar8 = bVar6 - 4;
                    if (((*(int *)((long)pvVar3 + 0x4f38) < iVar8) &&
                        (iVar9 = rar_br_fillup(local_138,local_100), iVar9 == 0)) &&
                       (*(int *)((long)pvVar3 + 0x4f38) < iVar8)) goto LAB_00635946;
                    iVar8 = *(int *)((long)pvVar3 + 0x4f38) - iVar8;
                    iVar27 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar8 & 0x3f)) &
                             *(uint *)("" + (ulong)bVar6 * 4 + 1)) * 0x10 + iVar27;
                    *(int *)((long)pvVar3 + 0x4f38) = iVar8;
                  }
                  if (*(int *)((long)pvVar3 + 900) == 0) {
                    iVar8 = read_next_symbol(local_138,local_58);
                    if (iVar8 < 0) {
                      return -0x1e;
                    }
                    if (iVar8 != 0x10) {
                      iVar27 = iVar27 + iVar8;
                      *(int *)((long)pvVar3 + 0x380) = iVar8;
                      goto LAB_0063548a;
                    }
                    *(undefined4 *)((long)pvVar3 + 900) = 0xf;
                  }
                  else {
                    *(int *)((long)pvVar3 + 900) = *(int *)((long)pvVar3 + 900) + -1;
                  }
                  iVar27 = iVar27 + *(int *)((long)pvVar3 + 0x380);
                }
              }
LAB_0063548a:
              uVar4 = *local_90;
              *(undefined4 *)(local_98 + 1) = *(undefined4 *)(local_90 + 1);
              *local_98 = uVar4;
              uVar26 = iVar7 + (uint)(0x3ffff < iVar27) + (uint)(0x1fff < iVar27);
            }
            *(int *)((long)pvVar3 + 0x370) = iVar27;
            goto LAB_006354cb;
          }
          pvVar20 = a_00->format->data;
          iVar7 = rar_decode_byte(a_00,&local_139);
          if (iVar7 == 0) {
            return -0x1e;
          }
          local_130 = CONCAT44(local_130._4_4_,(uint)local_139);
          uVar14 = (local_139 & 7) + 1;
          if ((char)uVar14 == '\a') {
            iVar7 = rar_decode_byte(a_00,&local_13a);
            if (iVar7 == 0) {
              return -0x1e;
            }
            uVar14 = local_13a + 7;
          }
          else if ((char)uVar14 == '\b') {
            iVar7 = rar_decode_byte(a_00,&local_13a);
            bVar6 = local_13a;
            if (iVar7 == 0) {
              return -0x1e;
            }
            iVar7 = rar_decode_byte(a_00,&local_13a);
            if (iVar7 == 0) {
              return -0x1e;
            }
            uVar14 = (uint)CONCAT11(bVar6,local_13a);
          }
          uVar19 = (ulong)uVar14;
          puVar12 = (uint8_t *)malloc(uVar19);
          local_50 = pvVar20;
          local_a8 = puVar12;
          uVar15 = uVar19;
          if (puVar12 == (uint8_t *)0x0) {
            return -0x1e;
          }
          for (; uVar15 != 0; uVar15 = uVar15 - 1) {
            iVar7 = rar_decode_byte(a_00,puVar12);
            if (iVar7 == 0) goto LAB_00635934;
            puVar12 = puVar12 + 1;
          }
          pvVar20 = a_00->format->data;
          local_128.offset = 0;
          local_128.bits = 0;
          local_128.available = 0;
          local_128.at_eof = 0;
          local_78 = 0;
          uStack_70 = 0;
          local_88 = 0;
          uStack_80 = 0;
          uVar14 = 0;
          for (lVar29 = *(long *)((long)pvVar20 + 0x398); lVar29 != 0;
              lVar29 = *(long *)(lVar29 + 0x30)) {
            uVar14 = uVar14 + 1;
          }
          local_128.bytes = local_a8;
          local_128.length = uVar19;
          local_b0 = pvVar20;
          if ((char)local_130 < '\0') {
            uVar10 = membr_next_rarvm_number(&local_128);
            if (uVar10 == 0) {
              delete_filter(*(rar_filter **)((long)pvVar20 + 0x3a0));
              uVar26 = 0;
              *(undefined8 *)((long)pvVar20 + 0x3a0) = 0;
              delete_program_code(*(rar_program_code **)((long)pvVar20 + 0x398));
              *(undefined8 *)((long)pvVar20 + 0x398) = 0;
            }
            else {
              uVar26 = uVar10 - 1;
            }
            if (uVar14 < uVar26) goto LAB_00635934;
            *(uint *)((long)local_b0 + 0x3b0) = uVar26;
          }
          else {
            uVar26 = *(uint *)((long)pvVar20 + 0x3b0);
          }
          if (uVar14 < uVar26) {
            __assert_fail("num <= numprogs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibarchive/libarchive/archive_read_support_format_rar.c"
                          ,0xc8b,
                          "int parse_filter(struct archive_read *, const uint8_t *, uint16_t, uint8_t)"
                         );
          }
          plVar1 = (long *)((long)local_b0 + 0x398);
          prog = (rar_program_code *)*plVar1;
          for (; uVar26 != 0; uVar26 = uVar26 - 1) {
            prog = prog->next;
          }
          if (prog != (rar_program_code *)0x0) {
            prog->usagecount = prog->usagecount + 1;
          }
          uVar10 = membr_next_rarvm_number(&local_128);
          local_a0 = *(long *)((long)local_b0 + 0x360) + 0x102;
          if ((local_130 & 0x40) == 0) {
            local_a0 = *(long *)((long)local_b0 + 0x360);
          }
          local_a0 = local_a0 + (ulong)uVar10;
          if ((local_130 & 0x20) == 0) {
            if (prog == (rar_program_code *)0x0) {
              local_f4 = 0;
            }
            else {
              local_f4 = prog->oldfilterlength;
            }
          }
          else {
            local_f4 = membr_next_rarvm_number(&local_128);
          }
          uStack_80 = CONCAT44(0x3c000,(undefined4)uStack_80);
          if (prog == (rar_program_code *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = prog->usagecount;
          }
          local_78 = CONCAT44(uVar10,local_f4);
          uStack_70 = CONCAT44(0x40000,(undefined4)uStack_70);
          if ((local_130 & 0x10) != 0) {
            if (local_128.available < 7) {
              uVar14 = 0;
              if (local_128.at_eof == 0) {
                iVar7 = local_128.available;
                if (local_128.offset < local_128.length) {
                  do {
                    uVar15 = local_128.offset + 1;
                    local_128.bits = (ulong)local_128.bytes[local_128.offset] | local_128.bits << 8;
                    local_128.available = iVar7 + 8;
                    local_128.offset = uVar15;
                    if (-2 < iVar7) goto LAB_00635123;
                    iVar7 = iVar7 + 8;
                  } while (uVar15 != local_128.length);
                }
                local_128.at_eof = 1;
              }
            }
            else {
LAB_00635123:
              iVar7 = local_128.available + -7;
              local_128.available = iVar7;
              uVar14 = (uint)(local_128.bits >> ((byte)iVar7 & 0x3f)) & 0x7f;
            }
            lVar29 = 0;
            do {
              if ((uVar14 >> ((uint)lVar29 & 0x1f) & 1) != 0) {
                uVar10 = membr_next_rarvm_number(&local_128);
                *(uint32_t *)((long)&local_88 + lVar29 * 4) = uVar10;
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != 7);
          }
          end = local_f0;
          if (prog == (rar_program_code *)0x0) {
            uVar10 = membr_next_rarvm_number(&local_128);
            if (uVar10 - 0x10001 < 0xffff0000) {
LAB_00635661:
              bVar5 = false;
              prog = (rar_program_code *)0x0;
            }
            else {
              uVar15 = (ulong)uVar10;
              local_b8 = CONCAT44(extraout_var,uVar10);
              buf = (byte *)malloc(uVar15);
              if (buf == (byte *)0x0) goto LAB_00635661;
              if ((uint)local_b8 != 0) {
                uVar19 = 0;
                uVar22 = local_128.bits;
                sVar24 = local_128.offset;
                iVar7 = local_128.available;
                iVar27 = local_128.at_eof;
                do {
                  if (iVar7 < 8) {
                    if (iVar27 == 0) {
                      uVar23 = sVar24;
                      iVar8 = iVar7;
                      if (sVar24 < local_128.length) {
                        do {
                          sVar24 = uVar23 + 1;
                          uVar22 = (ulong)local_128.bytes[uVar23] | uVar22 << 8;
                          iVar7 = iVar8 + 8;
                          local_128.available = iVar7;
                          local_128.offset = sVar24;
                          local_128.bits = uVar22;
                          if (-1 < iVar8) goto LAB_00635227;
                          uVar23 = sVar24;
                          iVar8 = iVar7;
                        } while (local_128.length != sVar24);
                      }
                      local_128.at_eof = 1;
                      iVar27 = 1;
                    }
                    bVar6 = 0;
                  }
                  else {
LAB_00635227:
                    iVar7 = iVar7 + -8;
                    local_128.available = iVar7;
                    bVar6 = (byte)(uVar22 >> ((byte)iVar7 & 0x3f));
                  }
                  buf[uVar19] = bVar6;
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar15);
              }
              local_e8.offset = 0;
              local_e8.bits = 0;
              local_e8.bytes = (byte *)0x0;
              local_e8.length = 0;
              local_e8.available = 0;
              local_e8.at_eof = 0;
              if ((uint)local_b8 < 2) {
                bVar6 = 0;
              }
              else {
                uVar19 = 1;
                bVar6 = 0;
                do {
                  bVar6 = bVar6 ^ buf[uVar19];
                  uVar19 = uVar19 + 1;
                } while (uVar15 != uVar19);
              }
              local_60 = buf;
              if (((uint)local_b8 == 0) || (bVar6 != *buf)) {
LAB_00635635:
                prog = (rar_program_code *)0x0;
              }
              else {
                local_e8.offset = 1;
                local_e8.bytes = buf;
                local_e8.length = uVar15;
                prog = (rar_program_code *)calloc(1,0x38);
                if (prog == (rar_program_code *)0x0) goto LAB_00635635;
                uVar13 = cm_zlib_crc32(0,buf,(uInt)local_b8);
                prog->fingerprint = uVar15 << 0x20 | uVar13;
                if (local_e8.available < 1) {
                  if (local_e8.at_eof == 0) {
                    iVar7 = local_e8.available;
                    if (local_e8.offset < local_e8.length) {
                      do {
                        uVar15 = local_e8.offset + 1;
                        local_e8.bits = (ulong)local_e8.bytes[local_e8.offset] | local_e8.bits << 8;
                        local_e8.available = iVar7 + 8;
                        local_e8.offset = uVar15;
                        if (-8 < iVar7) goto LAB_0063534d;
                        iVar7 = iVar7 + 8;
                      } while (uVar15 != local_e8.length);
                    }
                    local_e8.at_eof = 1;
                  }
                }
                else {
LAB_0063534d:
                  uVar14 = local_e8.available - 1;
                  local_e8.available = uVar14;
                  if ((local_e8.bits >> ((ulong)uVar14 & 0x3f) & 1) != 0) {
                    uVar10 = membr_next_rarvm_number(&local_e8);
                    uVar14 = uVar10 + 1;
                    prog->staticdatalen = uVar14;
                    puVar12 = (uint8_t *)malloc((ulong)uVar14);
                    prog->staticdata = puVar12;
                    if (puVar12 == (uint8_t *)0x0) {
                      delete_program_code(prog);
                      goto LAB_00635635;
                    }
                    if (uVar14 != 0) {
                      uVar15 = 0;
                      do {
                        if (local_e8.available < 8) {
                          if (local_e8.at_eof == 0) {
                            iVar7 = local_e8.available;
                            if (local_e8.offset < local_e8.length) {
                              do {
                                uVar19 = local_e8.offset + 1;
                                local_e8.bits =
                                     (ulong)local_e8.bytes[local_e8.offset] | local_e8.bits << 8;
                                local_e8.available = iVar7 + 8;
                                local_e8.offset = uVar19;
                                if (-1 < iVar7) goto LAB_00635421;
                                iVar7 = iVar7 + 8;
                              } while (uVar19 != local_e8.length);
                            }
                            local_e8.at_eof = 1;
                          }
                          uVar16 = '\0';
                        }
                        else {
LAB_00635421:
                          iVar7 = local_e8.available + -8;
                          local_e8.available = iVar7;
                          uVar16 = (uint8_t)(local_e8.bits >> ((byte)iVar7 & 0x3f));
                        }
                        prog->staticdata[uVar15] = uVar16;
                        uVar15 = uVar15 + 1;
                      } while (uVar15 < prog->staticdatalen);
                    }
                  }
                }
              }
              free(local_60);
              if (prog == (rar_program_code *)0x0) goto LAB_00635661;
              do {
                plVar17 = plVar1;
                lVar29 = *plVar17;
                plVar1 = (long *)(lVar29 + 0x30);
              } while (lVar29 != 0);
              *plVar17 = (long)prog;
              bVar5 = true;
            }
            if (!bVar5) goto LAB_00635934;
          }
          prog->oldfilterlength = local_f4;
          if ((local_130 & 8) == 0) {
            uVar15 = 0;
            pvVar20 = (void *)0x0;
          }
          else {
            uVar10 = membr_next_rarvm_number(&local_128);
            if (0x1fc0 < uVar10) goto LAB_00635934;
            uVar15 = (ulong)uVar10;
            pvVar20 = malloc((ulong)(uVar10 + 0x40));
            if (pvVar20 == (void *)0x0) goto LAB_00635934;
            if (uVar10 != 0) {
              uVar19 = 0;
              uVar22 = local_128.bits;
              sVar24 = local_128.offset;
              iVar7 = local_128.available;
              iVar27 = local_128.at_eof;
              do {
                if (iVar7 < 8) {
                  if (iVar27 == 0) {
                    uVar23 = sVar24;
                    iVar8 = iVar7;
                    end = local_f0;
                    if (sVar24 < local_128.length) {
                      do {
                        sVar24 = uVar23 + 1;
                        uVar22 = (ulong)local_128.bytes[uVar23] | uVar22 << 8;
                        iVar7 = iVar8 + 8;
                        local_128.available = iVar7;
                        local_128.offset = sVar24;
                        local_128.bits = uVar22;
                        if (-1 < iVar8) goto LAB_00635743;
                        uVar23 = sVar24;
                        iVar8 = iVar7;
                      } while (local_128.length != sVar24);
                    }
                    local_128.at_eof = 1;
                    iVar27 = 1;
                    uVar25 = 0;
                  }
                  else {
                    uVar25 = 0;
                  }
                }
                else {
LAB_00635743:
                  iVar7 = iVar7 + -8;
                  local_128.available = iVar7;
                  uVar25 = (undefined1)(uVar22 >> ((byte)iVar7 & 0x3f));
                }
                *(undefined1 *)((long)pvVar20 + uVar19 + 0x40) = uVar25;
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar15);
            }
          }
          if (local_128.at_eof != 0) {
            free(pvVar20);
            goto LAB_00635934;
          }
          local_130 = uVar15;
          __ptr = (undefined8 *)calloc(1,0x58);
          if (__ptr == (undefined8 *)0x0) {
LAB_006357fa:
            __ptr = (undefined8 *)0x0;
          }
          else {
            *__ptr = prog;
            __size = 0x40;
            if (0x40 < (uint)local_130) {
              __size = local_130 & 0xffffffff;
            }
            *(int *)(__ptr + 6) = (int)__size;
            pvVar21 = calloc(1,__size);
            __ptr[5] = pvVar21;
            if (pvVar21 == (void *)0x0) {
              free(__ptr);
              goto LAB_006357fa;
            }
            if (pvVar20 != (void *)0x0) {
              memcpy(pvVar21,pvVar20,local_130 & 0xffffffff);
            }
            __ptr[3] = local_78;
            __ptr[4] = uStack_70;
            __ptr[1] = local_88;
            __ptr[2] = uStack_80;
            __ptr[7] = local_a0;
            *(uint32_t *)(__ptr + 8) = local_f4;
          }
          free(pvVar20);
          pvVar20 = local_50;
          if (__ptr == (undefined8 *)0x0) {
LAB_00635934:
            free(local_a8);
            return -0x1e;
          }
          lVar29 = 0;
          do {
            *(undefined4 *)(__ptr[5] + lVar29 * 4) = *(undefined4 *)((long)&local_88 + lVar29 * 4);
            lVar29 = lVar29 + 1;
          } while (lVar29 != 7);
          *(uint32_t *)(__ptr[5] + 0x1c) = local_f4;
          *(undefined4 *)(__ptr[5] + 0x20) = 0;
          *(uint32_t *)(__ptr[5] + 0x2c) = prog->usagecount;
          plVar1 = (long *)((long)local_b0 + 0x3a0);
          do {
            plVar17 = plVar1;
            lVar29 = *plVar17;
            plVar1 = (long *)(lVar29 + 0x50);
          } while (lVar29 != 0);
          *plVar17 = (long)__ptr;
          if (*(long *)(*(long *)((long)local_b0 + 0x3a0) + 0x50) == 0) {
            *(long *)((long)local_b0 + 0x3a8) = local_a0;
          }
          free(local_a8);
          if (*(long *)((long)pvVar20 + 0x3a8) < *end) {
            *end = *(long *)((long)pvVar20 + 0x3a8);
          }
        }
LAB_00635581:
        lVar29 = *(long *)((long)pvVar3 + 0x360);
        if (*end <= lVar29) {
          return 0;
        }
      } while (*(char *)((long)pvVar3 + 0x3d2) == '\0');
    }
    *end = lVar29;
  }
  return 0;
}

Assistant:

static int
expand(struct archive_read *a, int64_t *end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const int lengthb_min = minimum(
    (int)(sizeof(lengthbases)/sizeof(lengthbases[0])),
    (int)(sizeof(lengthbits)/sizeof(lengthbits[0]))
  );
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const int offsetb_min = minimum(
    (int)(sizeof(offsetbases)/sizeof(offsetbases[0])),
    (int)(sizeof(offsetbits)/sizeof(offsetbits[0]))
  );
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filters.filterstart < *end)
    *end = rar->filters.filterstart;

  while (1)
  {
    if(lzss_position(&rar->lzss) >= *end) {
      return (ARCHIVE_OK);
    }

    if(rar->is_ppmd_block) {
      *end = lzss_position(&rar->lzss);
      return (ARCHIVE_OK);
    }

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);

    if (symbol < 256)
    {
      lzss_emit_literal(rar, symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        *end = lzss_position(&rar->lzss);
        return (ARCHIVE_OK);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      if (!read_filter(a, end))
          return (ARCHIVE_FATAL);
      continue;
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol > lengthb_min)
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 > lengthb_min)
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol > offsetb_min)
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
          }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;

    lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}